

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildObjectAPIConstructorBody
          (SwiftGenerator *this,FieldDef *field,bool is_fixed,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *base_constructor)

{
  uint uVar1;
  Value *type_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  BaseType BVar7;
  EnumDef *ed;
  StructDef *pSVar8;
  byte bVar9;
  mapped_type *pmVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  ulong *puVar14;
  char *pcVar15;
  char *pcVar16;
  undefined8 uVar17;
  ulong uVar18;
  _Alloc_hider _Var19;
  int iVar20;
  bool bVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string nullable;
  string field_var;
  string is_required;
  string field_field;
  string type;
  key_type local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  key_type local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150 [2];
  long local_140 [2];
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)base_constructor;
  local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              buffer_constructor;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(local_150,&this->namer_,field);
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_1b0,&this->namer_,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&local_50,this,&type_00->type,false);
  paVar5 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"FIELDVAR","");
  this_00 = &this->code_;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this_00->value_map_,&local_190);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar5) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"VALUETYPE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this_00->value_map_,&local_190);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar5) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  bVar21 = field->presence != kRequired;
  iVar20 = 0x3681be;
  pcVar15 = "";
  pcVar16 = "";
  if (bVar21) {
    pcVar16 = "?";
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,pcVar16,pcVar16 + bVar21);
  BVar7 = (type_00->type).base_type;
  switch(BVar7) {
  case BASE_TYPE_STRING:
    std::operator+(&local_b0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: String",&local_190);
    CodeWriter::operator+=(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    paVar5 = &local_260.field_2;
    local_260._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    std::__cxx11::string::append((char *)&local_260);
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_150[0]);
    paVar2 = &local_200.field_2;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200.field_2._8_8_ = plVar11[3];
      local_200._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_200._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1d8,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar5) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if (field->presence == kDefault) {
      SwiftConstant_abi_cxx11_(&local_200,this,field);
      std::operator+(&local_240,&local_1b0," = \"");
      std::operator+(&local_220,&local_240,&local_200);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_220);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_260.field_2._M_allocated_capacity = *psVar13;
        local_260.field_2._8_8_ = plVar11[3];
        local_260._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar13;
        local_260._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_260._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e0,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar5) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
LAB_002fc125:
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (field->presence != kRequired) goto LAB_002fbf53;
      local_200._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_1b0._M_dataplus._M_p,
                 local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
      std::__cxx11::string::append((char *)&local_240);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_240,(ulong)local_200._M_dataplus._M_p);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220.field_2._8_8_ = plVar11[3];
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_220._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_220);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_260.field_2._M_allocated_capacity = *psVar13;
        local_260.field_2._8_8_ = plVar11[3];
        local_260._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar13;
        local_260._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_260._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e0,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar5) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) goto LAB_002fc125;
    }
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"    ","");
    BuildObjectAPIConstructorBodyVectors
              (this,field,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1e0,&local_200);
    break;
  case BASE_TYPE_STRUCT:
    GenType_abi_cxx11_(&local_200,this,&type_00->type,true);
    paVar5 = &local_260.field_2;
    local_260._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"VALUETYPE","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this_00->value_map_,&local_260);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar5) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    pSVar8 = (field->value).type.struct_def;
    if (pSVar8 == (StructDef *)0x0) {
      bVar9 = 0;
    }
    else {
      bVar9 = pSVar8->fixed;
    }
    bVar21 = field->presence == kRequired;
    if ((bVar9 & is_fixed & 1) != 0 || bVar21) {
      iVar20 = 0x374d53;
    }
    local_260._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,iVar20,((byte)~(bVar9 & is_fixed | bVar21) & 1) + iVar20);
    std::operator+(&local_70,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",&local_260);
    CodeWriter::operator+=(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_170,"",&local_1b0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_170);
    paVar2 = &local_1d0.field_2;
    puVar14 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_1d0.field_2._M_allocated_capacity = *puVar14;
      local_1d0.field_2._8_8_ = plVar11[3];
      local_1d0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *puVar14;
      local_1d0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1d0._M_string_length = plVar11[1];
    *plVar11 = (long)puVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1d0,(ulong)local_200._M_dataplus._M_p);
    paVar3 = &local_240.field_2;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_240.field_2._M_allocated_capacity = *psVar13;
      local_240.field_2._8_8_ = plVar11[3];
      local_240._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar13;
      local_240._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_240._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_240);
    paVar4 = &local_220.field_2;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_220.field_2._M_allocated_capacity = *psVar13;
      local_220.field_2._8_8_ = plVar11[3];
      local_220._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar13;
      local_220._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_220._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1e0,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar4) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar3) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    paVar6 = &local_170.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar6) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (((field->value).type.struct_def)->fixed == true) {
      std::operator+(&local_1d0,"",&local_1b0);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
      psVar13 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_240.field_2._M_allocated_capacity = *psVar13;
        local_240.field_2._8_8_ = puVar12[3];
        local_240._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar13;
        local_240._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_240._M_string_length = puVar12[1];
      *puVar12 = psVar13;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_150[0]);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220.field_2._8_8_ = plVar11[3];
        local_220._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_220._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1d8,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar4) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar3) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      local_90.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
      local_90._M_dataplus._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar2) {
LAB_002fc28f:
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(&local_1d0,"var __",&local_1b0);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_240.field_2._M_allocated_capacity = *psVar13;
        local_240.field_2._8_8_ = plVar11[3];
        local_240._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar13;
        local_240._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_240._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_150[0]);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220.field_2._8_8_ = plVar11[3];
        local_220._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_220._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1d8,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar4) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar3) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_90,"",&local_1b0);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_170.field_2._M_allocated_capacity = *psVar13;
        local_170.field_2._8_8_ = plVar11[3];
        local_170._M_dataplus._M_p = (pointer)paVar6;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar13;
        local_170._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_170._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_170,(ulong)local_1b0._M_dataplus._M_p);
      puVar14 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_1d0.field_2._M_allocated_capacity = *puVar14;
        local_1d0.field_2._8_8_ = plVar11[3];
        local_1d0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *puVar14;
        local_1d0._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1d0._M_string_length = plVar11[1];
      *plVar11 = (long)puVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_130 = local_120;
      if (field->presence == kRequired) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"!","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_260._M_dataplus._M_p,
                   local_260._M_dataplus._M_p + local_260._M_string_length);
      }
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar2) {
        uVar17 = local_1d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_128 + local_1d0._M_string_length) {
        uVar18 = 0xf;
        if (local_130 != local_120) {
          uVar18 = local_120[0];
        }
        if (uVar18 < local_128 + local_1d0._M_string_length) goto LAB_002fbea3;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
      }
      else {
LAB_002fbea3:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_130)
        ;
      }
      psVar13 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_240.field_2._M_allocated_capacity = *psVar13;
        local_240.field_2._8_8_ = puVar12[3];
        local_240._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar13;
        local_240._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_240._M_string_length = puVar12[1];
      *puVar12 = psVar13;
      puVar12[1] = 0;
      *(undefined1 *)psVar13 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_240);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220.field_2._8_8_ = plVar11[3];
        local_220._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar13;
        local_220._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_220._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1d8,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar4) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar3) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar6) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_002fc28f;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar5) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) goto LAB_002fbf53;
    goto LAB_002fbf46;
  case BASE_TYPE_UNION:
    ed = (field->value).type.enum_def;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
    BuildUnionEnumSwitchCase
              (this,ed,&local_1b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1d8,&local_200,false);
    goto LAB_002fbf3c;
  default:
    if (BVar7 == BASE_TYPE_UTYPE) goto LAB_002fbf53;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    std::__cxx11::string::append((char *)&local_260);
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_150[0]);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200.field_2._8_8_ = plVar11[3];
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_200._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1d8,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    bVar21 = field->presence == kOptional;
    if (bVar21) {
      pcVar15 = "?";
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,pcVar15,pcVar15 + bVar21);
    BVar7 = (type_00->type).base_type;
    uVar1 = BVar7 - BASE_TYPE_UTYPE;
    if ((BVar7 == BASE_TYPE_BOOL || 0xb < uVar1) ||
       ((uVar1 < 10 && ((field->value).type.enum_def != (EnumDef *)0x0)))) {
      if ((uVar1 < 10) && ((field->value).type.enum_def != (EnumDef *)0x0)) {
        GenEnumDefaultValue_abi_cxx11_(&local_260,this,field);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}","");
        CodeWriter::operator+=(this_00,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,local_1b0._M_dataplus._M_p,
                   local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
        std::__cxx11::string::append((char *)&local_240);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_240,(ulong)local_260._M_dataplus._M_p);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_220.field_2._M_allocated_capacity = *psVar13;
          local_220.field_2._8_8_ = plVar11[3];
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        }
        else {
          local_220.field_2._M_allocated_capacity = *psVar13;
          local_220._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_220._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_1e0,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_260.field_2._M_allocated_capacity;
        _Var19._M_p = local_260._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) goto LAB_002fbf34;
      }
      else if (BVar7 == BASE_TYPE_BOOL) {
        std::operator+(&local_f0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: Bool",&local_200);
        CodeWriter::operator+=(this_00,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (field->presence != kOptional) {
          std::operator+(&local_220,&local_1b0," = ");
          SwiftConstant_abi_cxx11_(&local_240,this,field);
          std::operator+(&local_260,&local_220,&local_240);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1e0,&local_260);
          goto LAB_002fbb13;
        }
      }
    }
    else {
      std::operator+(&local_d0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",&local_200);
      CodeWriter::operator+=(this_00,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (field->presence != kOptional) {
        std::operator+(&local_220,&local_1b0," = ");
        SwiftConstant_abi_cxx11_(&local_240,this,field);
        std::operator+(&local_260,&local_220,&local_240);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_1e0,&local_260);
LAB_002fbb13:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_220.field_2._M_allocated_capacity;
        _Var19._M_p = local_220._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
LAB_002fbf34:
          operator_delete(_Var19._M_p,uVar17 + 1);
        }
      }
    }
LAB_002fbf3c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) goto LAB_002fbf53;
    goto LAB_002fbf46;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
LAB_002fbf46:
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
LAB_002fbf53:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  return;
}

Assistant:

void BuildObjectAPIConstructorBody(
      const FieldDef &field, bool is_fixed,
      std::vector<std::string> &buffer_constructor,
      std::vector<std::string> &base_constructor) {
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", field_field);
    code_.SetValue("VALUETYPE", type);
    std::string is_required = field.IsRequired() ? "" : "?";

    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        const auto objtype = GenType(field.value.type, true);
        code_.SetValue("VALUETYPE", objtype);
        const auto optional =
            (field.value.type.struct_def && field.value.type.struct_def->fixed);
        std::string question_mark =
            (field.IsRequired() || (optional && is_fixed) ? "" : "?");

        code_ +=
            "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + question_mark;
        base_constructor.push_back("" + field_var + " = " + objtype + "()");

        if (field.value.type.struct_def->fixed) {
          buffer_constructor.push_back("" + field_var + " = _t." + field_field);
        } else {
          buffer_constructor.push_back("var __" + field_var + " = _t." +
                                       field_field);
          buffer_constructor.push_back(
              "" + field_var + " = __" + field_var +
              (field.IsRequired() ? "!" : question_mark) + ".unpack()");
        }
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
      case BASE_TYPE_VECTOR: {
        BuildObjectAPIConstructorBodyVectors(field, buffer_constructor,
                                             base_constructor, "    ");
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: String" + is_required;
        buffer_constructor.push_back(field_var + " = _t." + field_field);

        if (field.IsRequired()) {
          std::string default_value =
              field.IsDefault() ? SwiftConstant(field) : "";
          base_constructor.push_back(field_var + " = \"" + default_value +
                                     "\"");
          break;
        }
        if (field.IsDefault() && !field.IsRequired()) {
          std::string value = field.IsDefault() ? SwiftConstant(field) : "nil";
          base_constructor.push_back(field_var + " = \"" + value + "\"");
        }
        break;
      }
      case BASE_TYPE_UTYPE: break;
      case BASE_TYPE_UNION: {
        BuildUnionEnumSwitchCase(*field.value.type.enum_def, field_var,
                                 buffer_constructor);
        break;
      }
      default: {
        buffer_constructor.push_back(field_var + " = _t." + field_field);
        std::string nullable = field.IsOptional() ? "?" : "";
        if (IsScalar(field.value.type.base_type) &&
            !IsBool(field.value.type.base_type) && !IsEnum(field.value.type)) {
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + nullable;
          if (!field.IsOptional())
            base_constructor.push_back(field_var + " = " +
                                       SwiftConstant(field));
          break;
        }

        if (IsEnum(field.value.type)) {
          const auto default_value = IsEnum(field.value.type)
                                         ? GenEnumDefaultValue(field)
                                         : SwiftConstant(field);
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}";
          base_constructor.push_back(field_var + " = " + default_value);
          break;
        }

        if (IsBool(field.value.type.base_type)) {
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: Bool" + nullable;
          if (!field.IsOptional())
            base_constructor.push_back(field_var + " = " +
                                       SwiftConstant(field));
        }
      }
    }
  }